

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

ON_PlaneEquation * ON_PlaneEquation::CreateFromPointAndNormal(ON_3dPoint point,ON_3dVector normal)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  ON_PlaneEquation *in_RDI;
  double dVar4;
  ON_3dVector N;
  double in_stack_00000018;
  double in_stack_00000020;
  double in_stack_00000028;
  double in_stack_00000030;
  ON_3dVector local_68;
  double local_48;
  undefined8 uStack_40;
  double local_38;
  undefined8 uStack_30;
  double local_28;
  undefined8 uStack_20;
  
  if ((((1.23432101234321e+308 <= ABS(N.y)) || (1.23432101234321e+308 <= ABS(N.z))) ||
      (1.23432101234321e+308 <= ABS(in_stack_00000018))) ||
     (((1.23432101234321e+308 <= ABS(in_stack_00000020) ||
       (1.23432101234321e+308 <= ABS(in_stack_00000028))) ||
      (1.23432101234321e+308 <= ABS(in_stack_00000030))))) goto LAB_00584c57;
  local_38 = in_stack_00000020;
  uStack_30 = 0;
  local_28 = N.y;
  uStack_20 = 0;
  local_68.z = in_stack_00000030;
  local_68.x = in_stack_00000020;
  local_68.y = in_stack_00000028;
  ON_3dVector::Unitize(&local_68);
  bVar3 = ON_3dVector::IsUnitVector((ON_3dVector *)&stack0x00000020);
  if (bVar3) {
    dVar4 = ON_Length3d(local_68.x,local_68.y,local_68.z);
    local_48 = ABS(1.0 - dVar4);
    uStack_40 = 0;
    dVar4 = ON_Length3d(local_38,in_stack_00000028,in_stack_00000030);
    if (local_48 < ABS(1.0 - dVar4) * 0.9999999997671694) goto LAB_00584be4;
  }
  else {
LAB_00584be4:
    in_stack_00000030 = local_68.z;
    in_stack_00000020 = local_68.x;
    in_stack_00000028 = local_68.y;
  }
  bVar3 = ON_3dVector::IsUnitVector((ON_3dVector *)&stack0x00000020);
  if (bVar3) {
    ON_PlaneEquation(in_RDI);
    in_RDI->x = in_stack_00000020;
    in_RDI->y = in_stack_00000028;
    in_RDI->z = in_stack_00000030;
    in_RDI->d = -(in_stack_00000030 * in_stack_00000018 +
                 local_28 * in_stack_00000020 + in_stack_00000028 * N.z);
    return in_RDI;
  }
LAB_00584c57:
  dVar2 = NanPlaneEquation.d;
  dVar1 = NanPlaneEquation.y;
  dVar4 = NanPlaneEquation.x;
  in_RDI->z = NanPlaneEquation.z;
  in_RDI->d = dVar2;
  in_RDI->x = dVar4;
  in_RDI->y = dVar1;
  return in_RDI;
}

Assistant:

const ON_PlaneEquation ON_PlaneEquation::CreateFromPointAndNormal(
  ON_3dPoint point,
  ON_3dVector normal
)
{
  if (point.IsValid() && normal.IsValid())
  {
    const ON_3dVector N = normal.UnitVector();
    if (false == normal.IsUnitVector() || fabs(1.0 - N.Length()) < fabs(1.0 - normal.Length()) * (1.0 - ON_ZERO_TOLERANCE))
      normal = N; // N is a better unit vector
    if (normal.IsUnitVector())
    {
      ON_PlaneEquation e;
      e.x = normal.x;
      e.y = normal.y;
      e.z = normal.z;
      e.d = -(e.x * point.x + e.y * point.y + e.z * point.z);
      return e;
    }
  }
  return ON_PlaneEquation::NanPlaneEquation;
}